

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O3

StringRef __thiscall llbuild::buildsystem::BuildKey::getCustomTaskName(BuildKey *this)

{
  pointer pcVar1;
  Kind KVar2;
  StringRef SVar3;
  
  KVar2 = kindForIdentifier(*(this->key).key._M_dataplus._M_p);
  if (KVar2 == CustomTask) {
    pcVar1 = (this->key).key._M_dataplus._M_p;
    SVar3.Data = pcVar1 + 5;
    SVar3.Length._0_4_ = *(undefined4 *)(pcVar1 + 1);
    SVar3.Length._4_4_ = 0;
    return SVar3;
  }
  __assert_fail("isCustomTask()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0xe6,"StringRef llbuild::buildsystem::BuildKey::getCustomTaskName() const");
}

Assistant:

StringRef getCustomTaskName() const {
    assert(isCustomTask());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    return StringRef(&key.data()[1 + sizeof(uint32_t)], nameSize);
  }